

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_fav.cpp
# Opt level: O3

NETADDR * __thiscall CServerBrowserFavorites::UpdateFavorites(CServerBrowserFavorites *this)

{
  NETADDR *Addr;
  int *piVar1;
  uint uVar2;
  undefined8 uVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  CFavoriteServer *pCVar12;
  CServerBrowserFavorites *pCVar13;
  CFavoriteServer *dest;
  NETADDR *pNVar14;
  
  cVar8 = (this->m_FavLookup).m_Active;
  if (((bool)cVar8 != true) || ((this->m_FavLookup).m_HostLookup.m_Job.m_Status != 2)) {
    pNVar14 = (NETADDR *)0x0;
    goto LAB_0012c4ef;
  }
  iVar9 = (this->m_FavLookup).m_FavoriteIndex;
  lVar11 = (long)iVar9;
  if (lVar11 == -1) {
LAB_0012c4e3:
    pNVar14 = (NETADDR *)0x0;
  }
  else {
    if ((this->m_FavLookup).m_HostLookup.m_Job.m_Result != 0) {
      if (this->m_aFavoriteServers[lVar11].m_State != 0) {
        dest = this->m_aFavoriteServers + lVar11;
        iVar9 = iVar9 + 1;
        pCVar12 = this->m_aFavoriteServers + iVar9;
        iVar9 = this->m_NumFavoriteServers - iVar9;
        goto LAB_0012c4c6;
      }
      this->m_aFavoriteServers[lVar11].m_State = 2;
      goto LAB_0012c4e3;
    }
    Addr = &(this->m_FavLookup).m_HostLookup.m_Addr;
    pCVar12 = FindFavoriteByAddr(this,Addr,(int *)0x0);
    if (pCVar12 != (CFavoriteServer *)0x0) {
      if (pCVar12->m_State != 4) {
        str_copy(pCVar12->m_aHostname,
                 this->m_aFavoriteServers[(this->m_FavLookup).m_FavoriteIndex].m_aHostname,0x80);
        pCVar12->m_State = 4;
      }
      uVar2 = (this->m_FavLookup).m_FavoriteIndex;
      dest = this->m_aFavoriteServers + (int)uVar2;
      pCVar12 = dest + 1;
      iVar9 = ~uVar2 + this->m_NumFavoriteServers;
LAB_0012c4c6:
      mem_move(dest,pCVar12,iVar9 * 0xbc);
      this->m_NumFavoriteServers = this->m_NumFavoriteServers + -1;
      goto LAB_0012c4e3;
    }
    lVar11 = (long)(this->m_FavLookup).m_FavoriteIndex;
    if (this->m_aFavoriteServers[lVar11].m_State != 0) {
      iVar10 = net_addr_comp(&this->m_aFavoriteServers[this->m_NumFavoriteServers].m_Addr,Addr,1);
      iVar9 = (this->m_FavLookup).m_FavoriteIndex;
      lVar11 = (long)iVar9;
      if (iVar10 != 0) {
        RemoveFavoriteEntry(this,iVar9);
        goto LAB_0012c4e3;
      }
    }
    pNVar14 = &this->m_aFavoriteServers[lVar11].m_Addr;
    *(undefined8 *)(this->m_aFavoriteServers[lVar11].m_Addr.ip + 0xc) =
         *(undefined8 *)((this->m_FavLookup).m_HostLookup.m_Addr.ip + 0xc);
    uVar4 = Addr->ip[0];
    uVar5 = Addr->ip[1];
    uVar6 = Addr->ip[2];
    uVar7 = Addr->ip[3];
    uVar3 = *(undefined8 *)((this->m_FavLookup).m_HostLookup.m_Addr.ip + 4);
    pNVar14->type = Addr->type;
    pNVar14->ip[0] = uVar4;
    pNVar14->ip[1] = uVar5;
    pNVar14->ip[2] = uVar6;
    pNVar14->ip[3] = uVar7;
    *(undefined8 *)(this->m_aFavoriteServers[lVar11].m_Addr.ip + 4) = uVar3;
    this->m_aFavoriteServers[lVar11].m_State = 4;
  }
  (this->m_FavLookup).m_Active = false;
  cVar8 = '\0';
LAB_0012c4ef:
  if (((0 < (this->m_FavLookup).m_LookupCount) && (cVar8 == '\0')) &&
     (0 < (long)this->m_NumFavoriteServers)) {
    lVar11 = 0;
    pCVar13 = this;
    do {
      if (pCVar13->m_aFavoriteServers[0].m_State < 2) {
        (*(this->m_pEngine->super_IInterface)._vptr_IInterface[6])
                  (this->m_pEngine,&this->m_FavLookup,pCVar13,
                   (ulong)(uint)(this->m_pNetClient->super_CNetBase).m_Socket.type);
        (this->m_FavLookup).m_FavoriteIndex = (int)lVar11;
        piVar1 = &(this->m_FavLookup).m_LookupCount;
        *piVar1 = *piVar1 + -1;
        (this->m_FavLookup).m_Active = true;
        return pNVar14;
      }
      lVar11 = lVar11 + 1;
      pCVar13 = (CServerBrowserFavorites *)(pCVar13->m_aFavoriteServers + 1);
    } while (this->m_NumFavoriteServers != lVar11);
  }
  return pNVar14;
}

Assistant:

const NETADDR *CServerBrowserFavorites::UpdateFavorites()
{
	NETADDR *pResult = 0;

	// check if hostname lookup for favorites is done
	if(m_FavLookup.m_Active && m_FavLookup.m_HostLookup.m_Job.Status() == CJob::STATE_DONE)
	{
		// check if favorite has not been removed in the meanwhile
		if(m_FavLookup.m_FavoriteIndex != -1)
		{
			if(m_FavLookup.m_HostLookup.m_Job.Result() == 0)
			{
				CFavoriteServer *pEntry = FindFavoriteByAddr(m_FavLookup.m_HostLookup.m_Addr, 0);
				if(pEntry)
				{
					// address is already in the list -> acquire hostname if existing entry lacks it and drop multiple address entry
					if(pEntry->m_State != FAVSTATE_HOST)
					{
						str_copy(pEntry->m_aHostname, m_aFavoriteServers[m_FavLookup.m_FavoriteIndex].m_aHostname, sizeof(pEntry->m_aHostname));
						pEntry->m_State = FAVSTATE_HOST;
					}
					RemoveFavoriteEntry(m_FavLookup.m_FavoriteIndex);
				}
				else
				{
					// address wasn't in the list yet -> add it (optional check if hostname matches given address -> drop entry on fail)
					if(m_aFavoriteServers[m_FavLookup.m_FavoriteIndex].m_State == FAVSTATE_LOOKUP ||
						net_addr_comp(&m_aFavoriteServers[m_NumFavoriteServers].m_Addr, &m_FavLookup.m_HostLookup.m_Addr, true) == 0)
					{
						m_aFavoriteServers[m_FavLookup.m_FavoriteIndex].m_Addr = m_FavLookup.m_HostLookup.m_Addr;
						m_aFavoriteServers[m_FavLookup.m_FavoriteIndex].m_State = FAVSTATE_HOST;
						pResult = &m_aFavoriteServers[m_FavLookup.m_FavoriteIndex].m_Addr;
					}
					else
					{
						RemoveFavoriteEntry(m_FavLookup.m_FavoriteIndex);
					}
				}
			}
			else
			{
				// hostname lookup failed
				if(m_aFavoriteServers[m_FavLookup.m_FavoriteIndex].m_State == FAVSTATE_LOOKUP)
				{
					m_aFavoriteServers[m_FavLookup.m_FavoriteIndex].m_State = FAVSTATE_INVALID;
				}
				else
				{
					RemoveFavoriteEntry(m_FavLookup.m_FavoriteIndex);
				}
			}
		}
		m_FavLookup.m_Active = false;
	}

	// add hostname lookup for favorites
	if(m_FavLookup.m_LookupCount > 0 && !m_FavLookup.m_Active)
	{
		for(int i = 0; i < m_NumFavoriteServers; i++)
		{
			if(m_aFavoriteServers[i].m_State <= FAVSTATE_LOOKUPCHECK)
			{
				m_pEngine->HostLookup(&m_FavLookup.m_HostLookup, m_aFavoriteServers[i].m_aHostname, m_pNetClient->NetType());
				m_FavLookup.m_FavoriteIndex = i;
				--m_FavLookup.m_LookupCount;
				m_FavLookup.m_Active = true;
				break;
			}
		}
	}

	return pResult;
}